

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowAttrib(GLFWwindow *handle,int attrib,int value)

{
  uint enabled;
  _GLFWwindow *window;
  int value_local;
  int attrib_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      enabled = (uint)(value != 0);
      switch(attrib) {
      case 0x20003:
        if ((*(uint *)(handle + 8) != enabled) &&
           (*(uint *)(handle + 8) = enabled, *(long *)(handle + 0x40) == 0)) {
          _glfwPlatformSetWindowResizable((_GLFWwindow *)handle,enabled);
        }
        break;
      default:
        _glfwInputError(0x10003,"Invalid window attribute 0x%08X",(ulong)(uint)attrib);
        break;
      case 0x20005:
        if ((*(uint *)(handle + 0xc) != enabled) &&
           (*(uint *)(handle + 0xc) = enabled, *(long *)(handle + 0x40) == 0)) {
          _glfwPlatformSetWindowDecorated((_GLFWwindow *)handle,enabled);
        }
        break;
      case 0x20006:
        *(uint *)(handle + 0x10) = enabled;
        break;
      case 0x20007:
        if ((*(uint *)(handle + 0x14) != enabled) &&
           (*(uint *)(handle + 0x14) = enabled, *(long *)(handle + 0x40) == 0)) {
          _glfwPlatformSetWindowFloating((_GLFWwindow *)handle,enabled);
        }
      }
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/glfw/src/window.c"
                ,0x2ff,"void glfwSetWindowAttrib(GLFWwindow *, int, int)");
}

Assistant:

GLFWAPI void glfwSetWindowAttrib(GLFWwindow* handle, int attrib, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    value = value ? GLFW_TRUE : GLFW_FALSE;

    switch (attrib)
    {
        case GLFW_RESIZABLE:
            if (window->resizable != value)
            {
                window->resizable = value;
                if (!window->monitor)
                    _glfwPlatformSetWindowResizable(window, value);
            }
            return;

        case GLFW_DECORATED:
            if (window->decorated != value)
            {
                window->decorated = value;
                if (!window->monitor)
                    _glfwPlatformSetWindowDecorated(window, value);
            }
            return;

        case GLFW_FLOATING:
            if (window->floating != value)
            {
                window->floating = value;
                if (!window->monitor)
                    _glfwPlatformSetWindowFloating(window, value);
            }
            return;

        case GLFW_AUTO_ICONIFY:
            window->autoIconify = value;
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
}